

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ugui.c
# Opt level: O3

ugui_t * ugui_create(uint32_t w,uint32_t h)

{
  ugui_t *puVar1;
  ugui_buffer_t *buffer;
  ugui_graphics_t *puVar2;
  
  puVar1 = (ugui_t *)malloc(0xa0);
  buffer = _ugui_buffer_create((uint16_t)w,(uint16_t)h,0,0);
  puVar1->buffer = buffer;
  puVar1->w = w;
  puVar1->h = h;
  memset(puVar1->windows,0,0x84);
  puVar2 = ugui_graphics_create(w,h,buffer);
  puVar1->graphics = puVar2;
  return puVar1;
}

Assistant:

ugui_t* ugui_create(uint32_t w, uint32_t h)
{
	ugui_t* gui = malloc(sizeof(struct ugui_s));

	gui->buffer = _ugui_buffer_create(w, h, 0, 0);

	gui->w = w;
	gui->h = h;
	gui->window_index = 0;

	for (int i = 0; i < UGUI_MAX_WINDOW_DEPTH; i++) {
		gui->windows[i] = NULL;
	}

	gui->graphics = ugui_graphics_create(w, h, gui->buffer);

	return gui;
}